

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

void anon_unknown.dwarf_15b62::ReportAt
               (ParseContext *ctx,Lexeme *begin,Lexeme *end,char *pos,char *msg,__va_list_tag *args)

{
  SmallArray<ErrorInfo_*,_4U> *this;
  char *__s;
  Allocator *pAVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  undefined4 extraout_var;
  char *pcVar6;
  ErrorInfo *pEVar5;
  
  pcVar6 = ctx->errorBuf;
  if ((pcVar6 != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = pos;
      ctx->errorBufLocation = pcVar6;
    }
    this = &ctx->errorInfo;
    uVar3 = (ctx->errorInfo).count;
    if ((uVar3 != 0) && (this->data[uVar3 - 1]->pos == pos)) {
      return;
    }
    __s = ctx->errorBufLocation;
    vsnprintf(__s,(ulong)(ctx->errorBufSize + ((int)pcVar6 - (int)__s)),msg,args);
    ctx->errorBuf[ctx->errorBufSize - 1] = '\0';
    pcVar6 = ctx->errorBufLocation;
    sVar4 = strlen(pcVar6);
    pcVar6 = pcVar6 + sVar4;
    ctx->errorBufLocation = pcVar6;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar5 = (ErrorInfo *)CONCAT44(extraout_var,iVar2);
    pAVar1 = ctx->allocator;
    pEVar5->messageStart = __s;
    pEVar5->messageEnd = pcVar6;
    pEVar5->begin = begin;
    pEVar5->end = end;
    pEVar5->pos = pos;
    (pEVar5->related).allocator = pAVar1;
    (pEVar5->related).data = (pEVar5->related).little;
    (pEVar5->related).count = 0;
    (pEVar5->related).max = 4;
    pEVar5->parentModule = (ModuleData *)0x0;
    uVar3 = (ctx->errorInfo).count;
    if (uVar3 == (ctx->errorInfo).max) {
      SmallArray<ErrorInfo_*,_4U>::grow(this,uVar3);
    }
    if (this->data == (ErrorInfo **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<ErrorInfo *, 4>::push_back(const T &) [T = ErrorInfo *, N = 4]"
                   );
    }
    uVar3 = (ctx->errorInfo).count;
    (ctx->errorInfo).count = uVar3 + 1;
    this->data[uVar3] = pEVar5;
    AddErrorLocationInfo
              (ctx->code,pos,ctx->errorBufLocation,
               (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
    pcVar6 = ctx->errorBufLocation;
    sVar4 = strlen(pcVar6);
    ctx->errorBufLocation = pcVar6 + sVar4;
  }
  uVar3 = ctx->errorCount + 1;
  ctx->errorCount = uVar3;
  if (uVar3 != 100) {
    return;
  }
  NULLC::SafeSprintf(ctx->errorBufLocation,
                     (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                            ctx->errorBufSize),"ERROR: error limit reached");
  pcVar6 = ctx->errorBufLocation;
  sVar4 = strlen(pcVar6);
  ctx->errorBufLocation = pcVar6 + sVar4;
  if (ctx->errorHandlerActive == false) {
    __assert_fail("ctx.errorHandlerActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0x37,
                  "void (anonymous namespace)::ReportAt(ParseContext &, Lexeme *, Lexeme *, const char *, const char *, __va_list_tag *)"
                 );
  }
  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
}

Assistant:

void ReportAt(ParseContext &ctx, Lexeme *begin, Lexeme *end, const char *pos, const char *msg, va_list args)
	{
		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = pos;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			// Don't report multiple errors at the same position
			if(!ctx.errorInfo.empty() && ctx.errorInfo.back()->pos == pos)
				return;

			const char *messageStart = ctx.errorBufLocation;

			vsnprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), msg, args);
			ctx.errorBuf[ctx.errorBufSize - 1] = '\0';

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			const char *messageEnd = ctx.errorBufLocation;

			ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, begin, end, pos));

			AddErrorLocationInfo(ctx.code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);
		}

		ctx.errorCount++;

		if(ctx.errorCount == 100)
		{
			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: error limit reached");

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}